

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

void sc_entry(GlobalVars *gv)

{
  bool bVar1;
  uint uVar2;
  char *s;
  char *pcVar3;
  long in_RDI;
  char *entryname;
  undefined2 uVar4;
  undefined8 in_stack_fffffffffffffff0;
  
  bVar1 = startofblock((char)((ulong)in_stack_fffffffffffffff0 >> 0x18));
  if (bVar1 != 0) {
    s = getalnum();
    pcVar3 = scriptname;
    if (s == (char *)0x0) {
      uVar2 = getlineno();
      uVar4 = (undefined2)((ulong)s >> 0x10);
      error(0x4e,pcVar3,(ulong)uVar2);
    }
    else {
      if (*(long *)(in_RDI + 0xe8) == 0) {
        pcVar3 = allocstring(s);
        *(char **)(in_RDI + 0xe8) = pcVar3;
      }
      uVar4 = (undefined2)((ulong)s >> 0x10);
    }
    endofblock((char)((ushort)uVar4 >> 8),(char)uVar4);
  }
  return;
}

Assistant:

static void sc_entry(struct GlobalVars *gv)
/* ENTRY(symbol or address) */
{
  if (startofblock('(')) {
    char *entryname;

    if (entryname = getalnum()) {
      if (gv->entry_name == NULL)
        gv->entry_name = allocstring(entryname);
    }
    else
      error(78,scriptname,getlineno());
    endofblock('(',')');
  }
}